

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_dependence_helpers.cpp
# Opt level: O0

Loop * __thiscall
spvtools::opt::LoopDependenceAnalysis::GetLoopForSubscriptPair
          (LoopDependenceAnalysis *this,
          pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair)

{
  bool bVar1;
  type *ppSVar2;
  type *ppSVar3;
  reference ppSVar4;
  size_type sVar5;
  reference ppLVar6;
  pair<std::__detail::_Node_iterator<const_spvtools::opt::Loop_*,_true,_false>,_bool> pVar7;
  _Node_iterator_base<const_spvtools::opt::Loop_*,_false> local_108;
  undefined4 local_100;
  allocator<char> local_f9;
  string local_f8;
  _Node_iterator_base<const_spvtools::opt::Loop_*,_false> local_d8;
  undefined1 local_d0;
  Loop *local_c8;
  __normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
  local_c0;
  __normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
  local_b8;
  iterator destination_nodes_it;
  Loop *local_a0;
  __normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
  local_98;
  __normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
  local_90;
  iterator source_nodes_it;
  unordered_set<const_spvtools::opt::Loop_*,_std::hash<const_spvtools::opt::Loop_*>,_std::equal_to<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  loops;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  destination_nodes;
  vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
  source_nodes;
  pair<spvtools::opt::SENode_*,_spvtools::opt::SENode_*> *subscript_pair_local;
  LoopDependenceAnalysis *this_local;
  
  ppSVar2 = std::get<0ul,spvtools::opt::SENode*,spvtools::opt::SENode*>(subscript_pair);
  SENode::CollectRecurrentNodes
            ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              *)&destination_nodes.
                 super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage,*ppSVar2);
  ppSVar3 = std::get<1ul,spvtools::opt::SENode*,spvtools::opt::SENode*>(subscript_pair);
  SENode::CollectRecurrentNodes
            ((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              *)&loops._M_h._M_single_bucket,*ppSVar3);
  memset(&source_nodes_it,0,0x38);
  std::
  unordered_set<const_spvtools::opt::Loop_*,_std::hash<const_spvtools::opt::Loop_*>,_std::equal_to<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  ::unordered_set((unordered_set<const_spvtools::opt::Loop_*,_std::hash<const_spvtools::opt::Loop_*>,_std::equal_to<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                   *)&source_nodes_it);
  local_90._M_current =
       (SERecurrentNode **)
       std::
       vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>::
       begin((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              *)&destination_nodes.
                 super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  while( true ) {
    local_98._M_current =
         (SERecurrentNode **)
         std::
         vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
         ::end((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *)&destination_nodes.
                   super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage);
    bVar1 = __gnu_cxx::operator!=(&local_90,&local_98);
    if (!bVar1) break;
    ppSVar4 = __gnu_cxx::
              __normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
              ::operator*(&local_90);
    local_a0 = SERecurrentNode::GetLoop(*ppSVar4);
    pVar7 = std::
            unordered_set<const_spvtools::opt::Loop_*,_std::hash<const_spvtools::opt::Loop_*>,_std::equal_to<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
            ::insert((unordered_set<const_spvtools::opt::Loop_*,_std::hash<const_spvtools::opt::Loop_*>,_std::equal_to<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                      *)&source_nodes_it,&local_a0);
    destination_nodes_it._M_current =
         (SERecurrentNode **)
         pVar7.first.super__Node_iterator_base<const_spvtools::opt::Loop_*,_false>._M_cur;
    __gnu_cxx::
    __normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
    ::operator++(&local_90);
  }
  local_b8._M_current =
       (SERecurrentNode **)
       std::
       vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>::
       begin((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              *)&loops._M_h._M_single_bucket);
  while( true ) {
    local_c0._M_current =
         (SERecurrentNode **)
         std::
         vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
         ::end((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
                *)&loops._M_h._M_single_bucket);
    bVar1 = __gnu_cxx::operator!=(&local_b8,&local_c0);
    if (!bVar1) break;
    ppSVar4 = __gnu_cxx::
              __normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
              ::operator*(&local_b8);
    local_c8 = SERecurrentNode::GetLoop(*ppSVar4);
    pVar7 = std::
            unordered_set<const_spvtools::opt::Loop_*,_std::hash<const_spvtools::opt::Loop_*>,_std::equal_to<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
            ::insert((unordered_set<const_spvtools::opt::Loop_*,_std::hash<const_spvtools::opt::Loop_*>,_std::equal_to<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                      *)&source_nodes_it,&local_c8);
    local_d8._M_cur =
         (__node_type *)
         pVar7.first.super__Node_iterator_base<const_spvtools::opt::Loop_*,_false>._M_cur;
    local_d0 = pVar7.second;
    __gnu_cxx::
    __normal_iterator<spvtools::opt::SERecurrentNode_**,_std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>_>
    ::operator++(&local_b8);
  }
  sVar5 = std::
          unordered_set<const_spvtools::opt::Loop_*,_std::hash<const_spvtools::opt::Loop_*>,_std::equal_to<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
          ::size((unordered_set<const_spvtools::opt::Loop_*,_std::hash<const_spvtools::opt::Loop_*>,_std::equal_to<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                  *)&source_nodes_it);
  if (sVar5 == 1) {
    local_108._M_cur =
         (__node_type *)
         std::
         unordered_set<const_spvtools::opt::Loop_*,_std::hash<const_spvtools::opt::Loop_*>,_std::equal_to<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
         ::begin((unordered_set<const_spvtools::opt::Loop_*,_std::hash<const_spvtools::opt::Loop_*>,_std::equal_to<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                  *)&source_nodes_it);
    ppLVar6 = std::__detail::_Node_iterator<const_spvtools::opt::Loop_*,_true,_false>::operator*
                        ((_Node_iterator<const_spvtools::opt::Loop_*,_true,_false> *)&local_108);
    this_local = (LoopDependenceAnalysis *)*ppLVar6;
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_f8,"GetLoopForSubscriptPair found loops.size() != 1.",&local_f9);
    PrintDebug(this,&local_f8);
    std::__cxx11::string::~string((string *)&local_f8);
    std::allocator<char>::~allocator(&local_f9);
    this_local = (LoopDependenceAnalysis *)0x0;
  }
  local_100 = 1;
  std::
  unordered_set<const_spvtools::opt::Loop_*,_std::hash<const_spvtools::opt::Loop_*>,_std::equal_to<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
  ::~unordered_set((unordered_set<const_spvtools::opt::Loop_*,_std::hash<const_spvtools::opt::Loop_*>,_std::equal_to<const_spvtools::opt::Loop_*>,_std::allocator<const_spvtools::opt::Loop_*>_>
                    *)&source_nodes_it);
  std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>::
  ~vector((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
           *)&loops._M_h._M_single_bucket);
  std::vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>::
  ~vector((vector<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
           *)&destination_nodes.
              super__Vector_base<spvtools::opt::SERecurrentNode_*,_std::allocator<spvtools::opt::SERecurrentNode_*>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  return (Loop *)this_local;
}

Assistant:

const Loop* LoopDependenceAnalysis::GetLoopForSubscriptPair(
    const std::pair<SENode*, SENode*>& subscript_pair) {
  // Collect all the SERecurrentNodes.
  std::vector<SERecurrentNode*> source_nodes =
      std::get<0>(subscript_pair)->CollectRecurrentNodes();
  std::vector<SERecurrentNode*> destination_nodes =
      std::get<1>(subscript_pair)->CollectRecurrentNodes();

  // Collect all the loops stored by the SERecurrentNodes.
  std::unordered_set<const Loop*> loops{};
  for (auto source_nodes_it = source_nodes.begin();
       source_nodes_it != source_nodes.end(); ++source_nodes_it) {
    loops.insert((*source_nodes_it)->GetLoop());
  }
  for (auto destination_nodes_it = destination_nodes.begin();
       destination_nodes_it != destination_nodes.end();
       ++destination_nodes_it) {
    loops.insert((*destination_nodes_it)->GetLoop());
  }

  // If we didn't find 1 loop |subscript_pair| is a subscript over multiple or 0
  // loops. We don't handle this so return nullptr.
  if (loops.size() != 1) {
    PrintDebug("GetLoopForSubscriptPair found loops.size() != 1.");
    return nullptr;
  }
  return *loops.begin();
}